

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seose_compat.cpp
# Opt level: O3

string * seose_to_base62_abi_cxx11_(string *__return_storage_ptr__,uint16_t input)

{
  ushort uVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT62(in_register_00000032,input) != 0) {
    uVar2 = CONCAT62(in_register_00000032,input) & 0xffffffff;
    do {
      uVar1 = (ushort)uVar2;
      uVar3 = (uint)((uVar2 & 0xffff) >> 1) / 0x1f;
      std::operator+(&local_50,
                     "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                     [uVar3 * -0x3e + (int)uVar2 & 0xffff],__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (ulong)uVar3;
    } while (0x3d < uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string seose_to_base62(std::uint16_t input)
{
	static char dict[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

	std::string result;

	while (input > 0)
	{
		std::uint16_t x = input % 62;
		input /= 62;
		result = dict[x] + result;
	}

	return result;
}